

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,Context *param_3)

{
  deUint32 *this;
  RefData<vk::VkDevice_s_*> data;
  RefData<vk::VkDevice_s_*> data_00;
  RefData<vk::VkDevice_s_*> data_01;
  RefData<vk::VkDevice_s_*> data_02;
  allocator<char> local_889;
  string local_888;
  Move<vk::VkDevice_s_*> local_868;
  RefData<vk::VkDevice_s_*> local_850;
  undefined1 local_838 [8];
  Unique<vk::VkDevice_s_*> obj3;
  RefData<vk::VkDevice_s_*> local_808;
  undefined1 local_7f0 [8];
  Unique<vk::VkDevice_s_*> obj2;
  RefData<vk::VkDevice_s_*> local_7c0;
  undefined1 local_7a8 [8];
  Unique<vk::VkDevice_s_*> obj1;
  RefData<vk::VkDevice_s_*> local_778;
  undefined1 local_760 [8];
  Unique<vk::VkDevice_s_*> obj0;
  Resources res3;
  Resources res2;
  undefined1 local_3c8 [8];
  Resources res1;
  Resources res0;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = &res0.queueFamilyIndex;
  context_local = param_3;
  local_10 = __return_storage_ptr__;
  Environment::Environment((Environment *)this,context,1);
  Device::Resources::Resources
            ((Resources *)&res1.queueFamilyIndex,(Environment *)this,(Parameters *)&context_local);
  Device::Resources::Resources
            ((Resources *)local_3c8,(Environment *)this,(Parameters *)&context_local);
  Device::Resources::Resources
            ((Resources *)&res3.queueFamilyIndex,(Environment *)&res0.queueFamilyIndex,
             (Parameters *)&context_local);
  Device::Resources::Resources
            ((Resources *)&obj0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
             (Environment *)&res0.queueFamilyIndex,(Parameters *)&context_local);
  Device::create((Move<vk::VkDevice_s_*> *)
                 &obj1.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Environment *)&res0.queueFamilyIndex,(Resources *)&res1.queueFamilyIndex,
                 (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_778,(Move *)&obj1.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  data.deleter.m_destroyDevice = local_778.deleter.m_destroyDevice;
  data.object = local_778.object;
  data.deleter.m_allocator = local_778.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_760,data);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
            ((Move<vk::VkDevice_s_*> *)
             &obj1.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  Device::create((Move<vk::VkDevice_s_*> *)
                 &obj2.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Environment *)&res0.queueFamilyIndex,(Resources *)local_3c8,
                 (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_7c0,(Move *)&obj2.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  data_00.deleter.m_destroyDevice = local_7c0.deleter.m_destroyDevice;
  data_00.object = local_7c0.object;
  data_00.deleter.m_allocator = local_7c0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_7a8,data_00);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
            ((Move<vk::VkDevice_s_*> *)
             &obj2.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  Device::create((Move<vk::VkDevice_s_*> *)
                 &obj3.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Environment *)&res0.queueFamilyIndex,(Resources *)&res3.queueFamilyIndex,
                 (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_808,(Move *)&obj3.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  data_01.deleter.m_destroyDevice = local_808.deleter.m_destroyDevice;
  data_01.object = local_808.object;
  data_01.deleter.m_allocator = local_808.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_7f0,data_01);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
            ((Move<vk::VkDevice_s_*> *)
             &obj3.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  Device::create(&local_868,(Environment *)&res0.queueFamilyIndex,
                 (Resources *)&obj0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                 (Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_850,(Move *)&local_868);
  data_02.deleter.m_destroyDevice = local_850.deleter.m_destroyDevice;
  data_02.object = local_850.object;
  data_02.deleter.m_allocator = local_850.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_838,data_02);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_868);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_838);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_7f0);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_7a8);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"Ok",&local_889);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_888);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  Device::Resources::~Resources
            ((Resources *)&obj0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  Device::Resources::~Resources((Resources *)&res3.queueFamilyIndex);
  Device::Resources::~Resources((Resources *)local_3c8);
  Device::Resources::~Resources((Resources *)&res1.queueFamilyIndex);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}